

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_file_server.cpp
# Opt level: O3

bool __thiscall cppcms::impl::file_server::canonical(file_server *this,string *normal,string *real)

{
  char *pcVar1;
  char *__s;
  
  __s = canonicalize_file_name((normal->_M_dataplus)._M_p);
  if (__s != (char *)0x0) {
    pcVar1 = (char *)real->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)real,0,pcVar1,(ulong)__s);
    free(__s);
  }
  return __s != (char *)0x0;
}

Assistant:

bool file_server::canonical(std::string normal,std::string &real)
{
#ifndef CPPCMS_WIN_NATIVE


	#ifdef CPPCMS_HAVE_CANONICALIZE_FILE_NAME

		char *canon=::canonicalize_file_name(normal.c_str());
		if(!canon) return false;
		try { 
			real=canon;
		}
		catch(...)
		{
			free(canon);
			throw; 
		}
		free(canon);
		canon=0;

	#else
		#if defined(PATH_MAX)
			int len = PATH_MAX;
		#else
			int len = pathconf(normal.c_str(),_PC_PATH_MAX);
			if(len <= 0)
				len = 32768; // Hope it is enough
		#endif

		std::vector<char> buffer;
		try { 
			// Size may be not feasible for allocation according to POSIX
			buffer.resize(len,0);
		}
		catch(std::bad_alloc const &e) {
			buffer.resize(32768); 
		}

		char *canon = ::realpath(normal.c_str(),&buffer.front());
		if(!canon)
			return false;
		real = canon;
	#endif

#else
		wchar_t *wreal = 0;
		try {
			std::wstring wnormal = booster::locale::conv::utf_to_utf<wchar_t>(normal,booster::locale::conv::stop);
			wchar_t *wreal = _wfullpath(0,wnormal.c_str(),0);
			if(!wreal)
				return false;
			real = booster::locale::conv::utf_to_utf<char>(wreal,booster::locale::conv::stop);
			free(wreal);
			wreal = 0;
		}
		catch(booster::locale::conv::conversion_error const &) {
			if(wreal)
				free(wreal);
			return false;
		}
		// stat would not work on files like foo/ so remove the last slash as realpath
		// and canonicalize does
		if(real.size()>1 && real[real.size()-1]=='\\')
			real.resize(real.size()-1);
#endif
	return true;
}